

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

double * __thiscall Graph::getTotalLoss(Graph *this)

{
  double *pdVar1;
  pointer pLVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  lVar4 = 0x10;
  pdVar1 = (double *)operator_new__(0x10);
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  pLVar2 = (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = 0.0;
  dVar7 = 0.0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2) / 0x18);
      uVar3 = uVar3 + 1) {
    dVar6 = evaluateLossesAndFlows(this,1e-12,(int)uVar3);
    dVar7 = dVar7 + dVar6 * 100000.0;
    *pdVar1 = dVar7;
    pLVar2 = (this->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar5 = dVar5 + (double)*(int *)((long)pLVar2 + lVar4 + -8) * dVar6 * 100000.0 *
                    *(double *)((long)&pLVar2->level + lVar4);
    pdVar1[1] = dVar5;
    lVar4 = lVar4 + 0x18;
  }
  return pdVar1;
}

Assistant:

double * Graph::getTotalLoss(){
    double * total_loss = new double[2];
    total_loss[0] = 0.0;
    total_loss[1] = 0.0;
    for(int i = 0; i < this->loads.size() ; i++) {
        double lvl_loss = 100 * 1000 * this->evaluateLossesAndFlows(1e-12, i);
        total_loss[0] += lvl_loss;
        total_loss[1] += lvl_loss * this->loads[i].time * this->loads[i].cost;
    }
    return total_loss;
}